

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Bitmask sqlite3WhereExprUsageFull(WhereMaskSet *pMaskSet,Expr *p)

{
  ExprList *pEVar1;
  Expr *p_00;
  Bitmask BVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ExprList_item *pEVar7;
  Bitmask BVar8;
  
  if (p->op == 0xb3) {
    BVar8 = 1;
    if (pMaskSet->ix[0] != p->iTable) {
      if ((long)pMaskSet->n < 2) goto LAB_0019ab8b;
      lVar6 = 1;
      BVar8 = 0;
      do {
        if (pMaskSet->ix[lVar6] == p->iTable) {
          BVar8 = 1L << ((byte)lVar6 & 0x3f);
          break;
        }
        lVar6 = lVar6 + 1;
      } while (pMaskSet->n != lVar6);
    }
  }
  else {
LAB_0019ab8b:
    BVar8 = 0;
  }
  if (p->pLeft != (Expr *)0x0) {
    BVar2 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
    BVar8 = BVar8 | BVar2;
  }
  if (p->pRight == (Expr *)0x0) {
    if ((p->flags >> 0xc & 1) == 0) {
      pEVar1 = (p->x).pList;
      if (pEVar1 != (ExprList *)0x0) {
        if (pEVar1->nExpr < 1) {
          uVar3 = 0;
        }
        else {
          pEVar7 = pEVar1->a;
          lVar6 = 0;
          uVar3 = 0;
          do {
            if (pEVar7->pExpr == (Expr *)0x0) {
              uVar4 = 0;
            }
            else {
              uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar7->pExpr);
            }
            uVar3 = uVar3 | uVar4;
            lVar6 = lVar6 + 1;
            pEVar7 = pEVar7 + 1;
          } while (lVar6 < pEVar1->nExpr);
        }
        BVar8 = BVar8 | uVar3;
      }
      goto LAB_0019ac28;
    }
    if ((p->flags & 0x40) != 0) {
      pMaskSet->bVarSelect = 1;
    }
    uVar3 = exprSelectUsage(pMaskSet,(p->x).pSelect);
  }
  else {
    uVar3 = sqlite3WhereExprUsageNN(pMaskSet,p->pRight);
  }
  BVar8 = BVar8 | uVar3;
LAB_0019ac28:
  if (((p->op == 0xac) || (p->op == 0xa9)) && ((p->flags & 0x1000000) != 0)) {
    pEVar1 = ((p->y).pWin)->pPartition;
    if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
      uVar3 = 0;
    }
    else {
      pEVar7 = pEVar1->a;
      lVar6 = 0;
      uVar3 = 0;
      do {
        if (pEVar7->pExpr == (Expr *)0x0) {
          uVar4 = 0;
        }
        else {
          uVar4 = sqlite3WhereExprUsageNN(pMaskSet,pEVar7->pExpr);
        }
        uVar3 = uVar3 | uVar4;
        lVar6 = lVar6 + 1;
        pEVar7 = pEVar7 + 1;
      } while (lVar6 < pEVar1->nExpr);
    }
    pEVar1 = ((p->y).pWin)->pOrderBy;
    if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr < 1)) {
      uVar4 = 0;
    }
    else {
      pEVar7 = pEVar1->a;
      lVar6 = 0;
      uVar4 = 0;
      do {
        if (pEVar7->pExpr == (Expr *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = sqlite3WhereExprUsageNN(pMaskSet,pEVar7->pExpr);
        }
        uVar4 = uVar4 | uVar5;
        lVar6 = lVar6 + 1;
        pEVar7 = pEVar7 + 1;
      } while (lVar6 < pEVar1->nExpr);
    }
    p_00 = ((p->y).pWin)->pFilter;
    if (p_00 == (Expr *)0x0) {
      BVar2 = 0;
    }
    else {
      BVar2 = sqlite3WhereExprUsageNN(pMaskSet,p_00);
    }
    BVar8 = BVar2 | BVar8 | uVar3 | uVar4;
  }
  return BVar8;
}

Assistant:

static SQLITE_NOINLINE Bitmask sqlite3WhereExprUsageFull(
  WhereMaskSet *pMaskSet,
  Expr *p
){
  Bitmask mask;
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprUseXSelect(p) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
#ifndef SQLITE_OMIT_WINDOWFUNC
  if( (p->op==TK_FUNCTION || p->op==TK_AGG_FUNCTION) && ExprUseYWin(p) ){
    assert( p->y.pWin!=0 );
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pPartition);
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, p->y.pWin->pFilter);
  }
#endif
  return mask;
}